

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O0

Pass * wasm::createLegalizeJSInterfacePass(void)

{
  LegalizeJSInterface *this;
  
  this = (LegalizeJSInterface *)operator_new(0xa8);
  anon_unknown_0::LegalizeJSInterface::LegalizeJSInterface(this);
  return &this->super_Pass;
}

Assistant:

Pass* createLegalizeJSInterfacePass() { return new LegalizeJSInterface(); }